

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VWrmsNorm_ManyVector(N_Vector x,N_Vector w)

{
  N_Vector in_RDI;
  sunrealtype sVar1;
  N_Vector unaff_retaddr;
  sunrealtype gsum;
  SUNContext_conflict sunctx_local_scope_;
  double local_28;
  
  sVar1 = N_VWSqrSumLocal_ManyVector(unaff_retaddr,in_RDI);
  if (0.0 < sVar1 / (double)*(long *)((long)in_RDI->content + 8)) {
    local_28 = sqrt(sVar1 / (double)*(long *)((long)in_RDI->content + 8));
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

sunrealtype MVAPPEND(N_VWrmsNorm)(N_Vector x, N_Vector w)
{
  SUNFunctionBegin(x->sunctx);
  sunrealtype gsum;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  sunrealtype lsum;
  lsum = gsum = N_VWSqrSumLocal_MPIManyVector(x, w);
  SUNCheckLastErrNoRet();
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICallNoRet(MPI_Allreduce(&lsum, &gsum, 1, MPI_SUNREALTYPE,
                                       MPI_SUM, MANYVECTOR_COMM(x)));
  }
#else
  gsum = N_VWSqrSumLocal_ManyVector(x, w);
  SUNCheckLastErrNoRet();
#endif
  return (SUNRsqrt(gsum / (MANYVECTOR_GLOBLENGTH(x))));
}